

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_store(parser *p)

{
  ushort uVar1;
  int iVar2;
  store *psVar3;
  store *v;
  char *pcVar4;
  store *s;
  store *h;
  parser *p_local;
  
  psVar3 = (store *)parser_priv(p);
  uVar1 = z_info->store_max;
  z_info->store_max = uVar1 + 1;
  v = store_new((uint)uVar1);
  pcVar4 = parser_getstr(p,"name");
  pcVar4 = string_make(pcVar4);
  v->name = pcVar4;
  iVar2 = strcmp(v->name,"Black Market");
  if (iVar2 == 0) {
    store_black_market_idx = v->sidx;
  }
  else {
    iVar2 = strcmp(v->name,"Travelling Merchant");
    if (iVar2 == 0) {
      store_merchant_idx = v->sidx;
    }
    else {
      iVar2 = strcmp(v->name,"Home");
      if (iVar2 == 0) {
        store_home_idx = v->sidx;
      }
    }
  }
  v->next = psVar3;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_store(struct parser *p) {
	struct store *h = parser_priv(p);
	struct store *s;

	s = store_new(z_info->store_max++);
	s->name = string_make(parser_getstr(p, "name"));

	/* Note black market and home */
	if (streq(s->name, "Black Market")) {
		store_black_market_idx = s->sidx;
	} else if (streq(s->name, "Travelling Merchant")) {
		store_merchant_idx = s->sidx;
	} else if (streq(s->name, "Home")) {
		store_home_idx = s->sidx;
	}

	s->next = h;
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}